

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM483I.cpp
# Opt level: O3

void * IM483IThread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  uint bForce;
  SOCKET SVar10;
  long lVar11;
  char *pcVar12;
  CHRONO chrono_sail_calibration;
  CHRONO chrono_period;
  IM483I im483i;
  char szTemp [256];
  char szSaveFilePath [256];
  timespec local_850;
  int local_840;
  int local_83c;
  double local_838;
  timespec local_830;
  long local_820;
  long lStack_818;
  long local_810;
  long lStack_808;
  timespec local_800;
  int local_7f0;
  timespec local_7e8;
  long local_7d8;
  long lStack_7d0;
  long local_7c8;
  long lStack_7c0;
  timespec local_7b8;
  int local_7a8;
  IM483I local_7a0;
  char local_238 [256];
  char local_138 [264];
  
  memset(&local_7a0,0,0x568);
  iVar4 = clock_getres(4,&local_800);
  if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_830), iVar4 == 0)) {
    local_7f0 = 0;
    local_820 = 0;
    lStack_818 = 0;
    local_810 = 0;
    lStack_808 = 0;
  }
  iVar4 = clock_getres(4,&local_7b8);
  if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_7e8), iVar4 == 0)) {
    local_7a8 = 0;
    local_7d8 = 0;
    lStack_7d0 = 0;
    local_7c8 = 0;
    lStack_7c0 = 0;
  }
  iVar4 = 0x32;
  bVar2 = false;
  local_83c = 0;
  do {
    bVar2 = !bVar2;
    local_840 = iVar4;
    while( true ) {
      if (local_7a8 == 0) {
        clock_gettime(4,&local_850);
        local_7d8 = local_850.tv_sec;
        lStack_7d0 = local_850.tv_nsec;
        local_850.tv_sec =
             ((local_850.tv_sec + local_7c8) - local_7e8.tv_sec) +
             (local_850.tv_nsec + lStack_7c0) / 1000000000;
        local_850.tv_nsec = (local_850.tv_nsec + lStack_7c0) % 1000000000 - local_7e8.tv_nsec;
        if (local_850.tv_nsec < 0) {
          local_850.tv_sec = local_850.tv_sec + ~((ulong)-local_850.tv_nsec / 1000000000);
          local_850.tv_nsec =
               local_850.tv_nsec + 1000000000 +
               ((ulong)-local_850.tv_nsec / 1000000000) * 1000000000;
        }
        local_7c8 = local_850.tv_sec;
        lStack_7c0 = local_850.tv_nsec;
      }
      iVar5 = clock_getres(4,&local_7b8);
      if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_7e8), iVar5 == 0)) {
        local_7a8 = 0;
        local_7c8 = 0;
        lStack_7c0 = 0;
        local_7d8 = 0;
        lStack_7d0 = 0;
      }
      local_850.tv_sec = (long)(iVar4 / 1000);
      local_850.tv_nsec = (long)((iVar4 % 1000) * 1000000);
      nanosleep(&local_850,(timespec *)0x0);
      iVar5 = local_840;
      if (bPauseIM483I == 0) break;
      if (!bVar2) {
        puts("IM483I paused.");
        SVar10 = local_7a0.RS232Port.s;
        switch(local_7a0.RS232Port.DevType) {
        case 0:
          iVar5 = (int)local_7a0.RS232Port.hDev;
          goto LAB_001c9707;
        case 1:
        case 3:
          iVar5 = local_7a0.RS232Port.s;
          break;
        case 2:
          shutdown(local_7a0.RS232Port.s,2);
          close(SVar10);
        case 4:
          iVar5 = local_7a0.RS232Port.s_srv;
          break;
        default:
          goto switchD_001c96cf_default;
        }
        shutdown(iVar5,2);
LAB_001c9707:
        iVar5 = close(iVar5);
        pcVar12 = "IM483I disconnected.";
        if (iVar5 != 0) {
switchD_001c96cf_default:
          pcVar12 = "IM483I disconnection failed.";
        }
        puts(pcVar12);
      }
      if (bExit != 0) goto LAB_001c9ec3;
      local_850.tv_sec = 0;
      local_850.tv_nsec = 100000000;
      nanosleep(&local_850,(timespec *)0x0);
      bVar2 = true;
    }
    if (bRestartIM483I == 0) {
      if (bVar2) goto LAB_001c99ce;
      if (((robid != 0x2000) && (robid != 0x8000)) && (iVar4 = local_840, robid != 0x4000))
      goto LAB_001c9aa0;
      lVar11 = local_810;
      lVar8 = lStack_808;
      if (local_7f0 == 0) {
        clock_gettime(4,&local_850);
        lVar11 = ((local_850.tv_sec + local_810) - local_830.tv_sec) +
                 (local_850.tv_nsec + lStack_808) / 1000000000;
        lVar8 = (local_850.tv_nsec + lStack_808) % 1000000000 - local_830.tv_nsec;
        if (lVar8 < 0) {
          lVar11 = lVar11 + ~((ulong)-lVar8 / 1000000000);
          lVar8 = lVar8 + 1000000000 + ((ulong)-lVar8 / 1000000000) * 1000000000;
        }
      }
      if (((sail_calibration_period < (double)lVar8 / 1000000000.0 + (double)lVar11) ||
          (bCalibrateSail != 0 && bSailCalibrated == 0)) || (bForceSailCalibration != 0)) {
        if (((bCalibrateSail != 0) && (bSailCalibrated == 0)) && (bCheckRudder != 0)) {
          local_850.tv_sec = 7;
          local_850.tv_nsec = 0;
          nanosleep(&local_850,(timespec *)0x0);
        }
        bSailCalibrated = 0;
        iVar4 = CalibrateMotorIM483I(&local_7a0);
        if (iVar4 == 0) {
          bSailCalibrated = 1;
          bForceSailCalibration = 0;
          if (local_7f0 == 0) {
            clock_gettime(4,&local_850);
            local_820 = local_850.tv_sec;
            lStack_818 = local_850.tv_nsec;
            local_850.tv_sec =
                 ((local_850.tv_sec + local_810) - local_830.tv_sec) +
                 (local_850.tv_nsec + lStack_808) / 1000000000;
            local_850.tv_nsec = (local_850.tv_nsec + lStack_808) % 1000000000 - local_830.tv_nsec;
            if (local_850.tv_nsec < 0) {
              local_850.tv_sec = local_850.tv_sec + ~((ulong)-local_850.tv_nsec / 1000000000);
              local_850.tv_nsec =
                   local_850.tv_nsec + 1000000000 +
                   ((ulong)-local_850.tv_nsec / 1000000000) * 1000000000;
            }
            local_810 = local_850.tv_sec;
            lStack_808 = local_850.tv_nsec;
          }
          iVar4 = clock_getres(4,&local_800);
          if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_830), iVar4 == 0)) {
            local_7f0 = 0;
            local_810 = 0;
            lStack_808 = 0;
            local_820 = 0;
            lStack_818 = 0;
          }
          goto LAB_001c9c96;
        }
        puts("Connection to a IM483I lost.");
        bSailCalibrated = 0;
        switch(local_7a0.RS232Port.DevType) {
        case 0:
switchD_001c994b_caseD_0:
          bSailCalibrated = 0;
          iVar4 = (int)local_7a0.RS232Port.hDev;
          goto LAB_001c9e90;
        case 1:
        case 3:
switchD_001c994b_caseD_1:
          bSailCalibrated = 0;
          iVar4 = local_7a0.RS232Port.s;
          break;
        case 2:
switchD_001c994b_caseD_2:
          SVar10 = local_7a0.RS232Port.s;
          bSailCalibrated = 0;
          shutdown(local_7a0.RS232Port.s,2);
          close(SVar10);
        case 4:
switchD_001c994b_caseD_4:
          iVar4 = local_7a0.RS232Port.s_srv;
          break;
        default:
          goto switchD_001c994b_default;
        }
        shutdown(iVar4,2);
LAB_001c9e90:
        iVar4 = close(iVar4);
        pcVar12 = "IM483I disconnected.";
        if (iVar4 != 0) {
switchD_001c994b_default:
          pcVar12 = "IM483I disconnection failed.";
        }
        puts(pcVar12);
        goto LAB_001c9a02;
      }
LAB_001c9c96:
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      if (u_f <= 0.0) {
        local_838 = local_7a0.MinAngle;
      }
      else {
        local_838 = u_f * (local_7a0.MaxAngle - local_7a0.MinAngle) + local_7a0.MinAngle;
      }
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      bForce = -(uint)(local_838 == 0.0) & 1;
      iVar4 = (int)((local_838 * 116000.0) / (local_7a0.MaxAngle - local_7a0.MinAngle));
      if (0x1c51f < iVar4) {
        iVar4 = 0x1c520;
      }
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      local_838 = local_838 * 116000.0;
      iVar4 = SetMotorRelativeIM483I(&local_7a0,-iVar4,bForce);
      if (iVar4 != 0) {
        iVar4 = 6;
        do {
          iVar4 = iVar4 + -1;
          if (iVar4 == 0) {
            puts("Connection to a IM483I lost.");
            bSailCalibrated = 0;
            iVar5 = local_840;
            switch(local_7a0.RS232Port.DevType) {
            case 0:
              goto switchD_001c994b_caseD_0;
            case 1:
            case 3:
              goto switchD_001c994b_caseD_1;
            case 2:
              goto switchD_001c994b_caseD_2;
            case 4:
              goto switchD_001c994b_caseD_4;
            }
            goto switchD_001c994b_default;
          }
          local_850.tv_sec = (__time_t)(local_7a0.timeout / 1000);
          local_850.tv_nsec = (long)((local_7a0.timeout % 1000) * 1000000);
          nanosleep(&local_850,(timespec *)0x0);
          iVar5 = (int)(local_838 / (local_7a0.MaxAngle - local_7a0.MinAngle));
          if (0x1c51f < iVar5) {
            iVar5 = 0x1c520;
          }
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          iVar5 = SetMotorRelativeIM483I(&local_7a0,-iVar5,bForce);
        } while (iVar5 != 0);
      }
      bVar3 = false;
      bVar2 = true;
      iVar4 = local_840;
    }
    else {
      if (!bVar2) {
        puts("Restarting a IM483I.");
        SVar10 = local_7a0.RS232Port.s;
        switch(local_7a0.RS232Port.DevType) {
        case 0:
          iVar4 = (int)local_7a0.RS232Port.hDev;
          goto LAB_001c99a3;
        case 1:
        case 3:
          iVar4 = local_7a0.RS232Port.s;
          break;
        case 2:
          shutdown(local_7a0.RS232Port.s,2);
          close(SVar10);
        case 4:
          iVar4 = local_7a0.RS232Port.s_srv;
          break;
        default:
          goto switchD_001c97a0_default;
        }
        shutdown(iVar4,2);
LAB_001c99a3:
        iVar4 = close(iVar4);
        pcVar12 = "IM483I disconnected.";
        if (iVar4 != 0) {
switchD_001c97a0_default:
          pcVar12 = "IM483I disconnection failed.";
        }
        puts(pcVar12);
      }
      bRestartIM483I = 0;
LAB_001c99ce:
      iVar6 = ConnectIM483I(&local_7a0,"IM483I0.txt");
      iVar4 = local_7a0.threadperiod;
      if (iVar6 == 0) {
        bSailCalibrated = 0;
        if ((FILE *)local_7a0.pfSaveFile != (FILE *)0x0) {
          fclose((FILE *)local_7a0.pfSaveFile);
          local_7a0.pfSaveFile = (FILE *)0x0;
        }
        if (local_7a0.bSaveRawData == 0) {
LAB_001c9aa0:
          bVar2 = true;
          bVar3 = false;
        }
        else {
          if (local_7a0.szCfgFilePath[0] == '\0') {
            builtin_strncpy(local_238,"im483i",7);
          }
          else {
            sprintf(local_238,"%.127s",local_7a0.szCfgFilePath);
          }
          sVar7 = strlen(local_238);
          iVar5 = (int)sVar7 + 1;
          uVar9 = sVar7 & 0xffffffff;
          do {
            if ((int)uVar9 < 1) goto LAB_001c9b04;
            uVar1 = uVar9 - 1;
            iVar5 = iVar5 + -1;
            lVar8 = uVar9 - 1;
            uVar9 = uVar1;
          } while (local_238[lVar8] != '.');
          if ((uVar1 != 0) && (iVar5 <= (int)sVar7)) {
            memset(local_238 + (uVar1 & 0xffffffff),0,sVar7 - (uVar1 & 0xffffffff));
          }
LAB_001c9b04:
          pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
          pcVar12 = strtimeex_fns();
          bVar3 = false;
          sprintf(local_138,"log/%.127s_%.64s.txt",local_238,pcVar12);
          pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
          bVar2 = true;
          local_7a0.pfSaveFile = (FILE *)fopen(local_138,"wb");
          if ((FILE *)local_7a0.pfSaveFile == (FILE *)0x0) {
            puts("Unable to create IM483I data file.");
            bVar3 = false;
            break;
          }
        }
      }
      else {
        local_850.tv_sec = 1;
        local_850.tv_nsec = 0;
        nanosleep(&local_850,(timespec *)0x0);
LAB_001c9a02:
        local_83c = local_83c + 1;
        if (ExitOnErrorCount <= local_83c && 0 < ExitOnErrorCount) {
          bExit = 1;
LAB_001c9ec3:
          bVar3 = true;
          break;
        }
        bVar2 = false;
        bVar3 = true;
        iVar4 = iVar5;
      }
    }
  } while (bExit == 0);
  if (local_7a8 == 0) {
    clock_gettime(4,&local_850);
    local_7d8 = local_850.tv_sec;
    lStack_7d0 = local_850.tv_nsec;
    local_850.tv_sec =
         ((local_850.tv_sec + local_7c8) - local_7e8.tv_sec) +
         (local_850.tv_nsec + lStack_7c0) / 1000000000;
    local_850.tv_nsec = (local_850.tv_nsec + lStack_7c0) % 1000000000 - local_7e8.tv_nsec;
    if (local_850.tv_nsec < 0) {
      local_850.tv_sec = local_850.tv_sec + ~((ulong)-local_850.tv_nsec / 1000000000);
      local_850.tv_nsec =
           local_850.tv_nsec + 1000000000 + ((ulong)-local_850.tv_nsec / 1000000000) * 1000000000;
    }
    local_7c8 = local_850.tv_sec;
    lStack_7c0 = local_850.tv_nsec;
  }
  if (local_7f0 == 0) {
    clock_gettime(4,&local_850);
    local_820 = local_850.tv_sec;
    lStack_818 = local_850.tv_nsec;
    local_850.tv_sec =
         ((local_850.tv_sec + local_810) - local_830.tv_sec) +
         (local_850.tv_nsec + lStack_808) / 1000000000;
    local_850.tv_nsec = (local_850.tv_nsec + lStack_808) % 1000000000 - local_830.tv_nsec;
    if (local_850.tv_nsec < 0) {
      local_850.tv_sec = local_850.tv_sec + ~((ulong)-local_850.tv_nsec / 1000000000);
      local_850.tv_nsec =
           local_850.tv_nsec + 1000000000 + ((ulong)-local_850.tv_nsec / 1000000000) * 1000000000;
    }
    local_810 = local_850.tv_sec;
    lStack_808 = local_850.tv_nsec;
  }
  if ((FILE *)local_7a0.pfSaveFile != (FILE *)0x0) {
    fclose((FILE *)local_7a0.pfSaveFile);
    local_7a0.pfSaveFile = (FILE *)0x0;
  }
  if (bVar3) goto LAB_001ca0f0;
  switch(local_7a0.RS232Port.DevType) {
  case 0:
    goto LAB_001ca0d0;
  case 1:
  case 3:
    SVar10 = local_7a0.RS232Port.s;
    break;
  case 2:
    shutdown(local_7a0.RS232Port.s,2);
    close(local_7a0.RS232Port.s);
  case 4:
    SVar10 = local_7a0.RS232Port.s_srv;
    break;
  default:
    goto switchD_001ca098_default;
  }
  shutdown(SVar10,2);
  local_7a0.RS232Port.hDev._0_4_ = SVar10;
LAB_001ca0d0:
  iVar4 = close((int)local_7a0.RS232Port.hDev);
  if (iVar4 == 0) {
    pcVar12 = "IM483I disconnected.";
  }
  else {
switchD_001ca098_default:
    pcVar12 = "IM483I disconnection failed.";
  }
  puts(pcVar12);
LAB_001ca0f0:
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE IM483IThread(void* pParam)
{
	IM483I im483i;
	double angle = 0;
	CHRONO chrono_sail_calibration;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&im483i, 0, sizeof(IM483I));

	StartChrono(&chrono_sail_calibration);

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseIM483I) 
		{
			if (bConnected)
			{
				printf("IM483I paused.\n");
				bConnected = FALSE;
				DisconnectIM483I(&im483i);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartIM483I) 
		{
			if (bConnected)
			{
				printf("Restarting a IM483I.\n");
				bConnected = FALSE;
				DisconnectIM483I(&im483i);
			}
			bRestartIM483I = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectIM483I(&im483i, "IM483I0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = im483i.threadperiod;

				//EnterCriticalSection(&StateVariablesCS);
				bSailCalibrated = FALSE;
				//LeaveCriticalSection(&StateVariablesCS);

				if (im483i.pfSaveFile != NULL)
				{
					fclose(im483i.pfSaveFile); 
					im483i.pfSaveFile = NULL;
				}
				if ((im483i.bSaveRawData)&&(im483i.pfSaveFile == NULL)) 
				{
					if (strlen(im483i.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", im483i.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "im483i");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					im483i.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (im483i.pfSaveFile == NULL) 
					{
						printf("Unable to create IM483I data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			switch (robid)
			{
			case SAILBOAT_ROBID: // For VSim compatibility...
			case SAILBOAT2_ROBID: // For VSim compatibility...
			case VAIMOS_ROBID:
				if ((GetTimeElapsedChronoQuick(&chrono_sail_calibration) > sail_calibration_period)||
					((bCalibrateSail)&&(!bSailCalibrated))||
					(bForceSailCalibration))
				{
					if ((bCalibrateSail)&&(!bSailCalibrated))
					{
						if (bCheckRudder) mSleep(7000); // Wait for the rudder check...
					}
					bSailCalibrated = FALSE;
					if (CalibrateMotorIM483I(&im483i) != EXIT_SUCCESS)
					{
						printf("Connection to a IM483I lost.\n");
						bSailCalibrated = FALSE;
						bConnected = FALSE;
						DisconnectIM483I(&im483i);
						break;
					}
					bSailCalibrated = TRUE;
					bForceSailCalibration = FALSE;
					StopChronoQuick(&chrono_sail_calibration);
					StartChrono(&chrono_sail_calibration);
				}
				EnterCriticalSection(&StateVariablesCS);
				//angle = deltasmax;
				if (u_f > 0) angle = u_f*(im483i.MaxAngle-im483i.MinAngle)+im483i.MinAngle; else angle = im483i.MinAngle;
				LeaveCriticalSection(&StateVariablesCS);
				//if ((!im483i.bNoContinuousUpdateMaxAngle)||(bUpdateMaxAngleIM483I)) { ... bUpdateMaxAngleIM483I = FALSE; }
				i = 0;
				while (SetMaxAngleIM483I(&im483i, angle) != EXIT_SUCCESS)
				{
					if (i > 4)
					{
						printf("Connection to a IM483I lost.\n");
						bSailCalibrated = FALSE;
						bConnected = FALSE;
						DisconnectIM483I(&im483i);
						break;
					}
					mSleep(im483i.timeout);
					i++;
				}
				break;
			default:
				break;
			}
		}

		//printf("IM483IThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	StopChronoQuick(&chrono_sail_calibration);

	if (im483i.pfSaveFile != NULL)
	{
		fclose(im483i.pfSaveFile); 
		im483i.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectIM483I(&im483i);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}